

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTPrinter.cc
# Opt level: O1

int __thiscall
flow::lang::ASTPrinter::accept(ASTPrinter *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  char *args;
  uint uVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  LiteralType type;
  undefined4 in_register_00000034;
  long lVar2;
  string local_40;
  
  lVar2 = CONCAT44(in_register_00000034,__fd);
  args = *(char **)(lVar2 + 0x48);
  if (*(long **)(lVar2 + 0x70) != (long *)0x0) {
    uVar1 = (**(code **)(**(long **)(lVar2 + 0x70) + 0x18))();
    tos_abi_cxx11_(&local_40,(flow *)(ulong)uVar1,type);
    printf<char_const*,char_const*>(this,"Variable: %s as %s\n",args,local_40._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    print(this,"initializer",*(ASTNode **)(lVar2 + 0x70));
    return extraout_EAX;
  }
  printf<char_const*>(this,"Variable: %s (NULL)\n",args);
  return extraout_EAX_00;
}

Assistant:

void ASTPrinter::accept(VariableSym& variable) {
  if (variable.initializer()) {
    printf("Variable: %s as %s\n", variable.name().c_str(),
           tos(variable.initializer()->getType()).c_str());
    print("initializer", variable.initializer());
  } else {
    printf("Variable: %s (NULL)\n", variable.name().c_str());
  }
}